

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord2.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord2::Decode
          (RectangularVolumeRecord2 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x57 < KVar1) {
    KDataStream::Read<unsigned_int>
              (stream,&(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                       m_ui32EnvRecTyp);
    KDataStream::Read<unsigned_short>
              (stream,&(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.m_ui16Length);
    KDataStream::Read(stream,&(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                              m_ui8Index);
    KDataStream::Read(stream,&(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                              m_ui8Padding);
    (*(this->super_RectangularVolumeRecord1).m_CornerLocation.super_DataTypeBase._vptr_DataTypeBase
      [3])(&(this->super_RectangularVolumeRecord1).m_CornerLocation,stream);
    (*(this->super_RectangularVolumeRecord1).m_RecLength.super_DataTypeBase._vptr_DataTypeBase[3])
              (&(this->super_RectangularVolumeRecord1).m_RecLength,stream);
    (*(this->m_DDT).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_DDT,stream);
    (*(this->super_RectangularVolumeRecord1).m_Ori.super_DataTypeBase._vptr_DataTypeBase[3])
              (&(this->super_RectangularVolumeRecord1).m_Ori,stream);
    (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Velocity,stream);
    (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AngularVelocity,stream);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void RectangularVolumeRecord2::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < RECTANGLE_VOLUME_RECORD_2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> KDIS_STREAM m_CornerLocation
           >> KDIS_STREAM m_RecLength
           >> KDIS_STREAM m_DDT
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_Velocity
           >> KDIS_STREAM m_AngularVelocity
           >> m_f32Padding;
}